

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesDeviceEccAvailable(zes_device_handle_t hDevice,ze_bool_t *pAvailable)

{
  zes_pfnDeviceEccAvailable_t pfnEccAvailable;
  ze_result_t result;
  ze_bool_t *pAvailable_local;
  zes_device_handle_t hDevice_local;
  
  pfnEccAvailable._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ca88 != (code *)0x0) {
    pfnEccAvailable._4_4_ = (*DAT_0011ca88)(hDevice,pAvailable);
  }
  return pfnEccAvailable._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEccAvailable(
        zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
        ze_bool_t* pAvailable                           ///< [out] ECC functionality is available (true)/unavailable (false).
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEccAvailable = context.zesDdiTable.Device.pfnEccAvailable;
        if( nullptr != pfnEccAvailable )
        {
            result = pfnEccAvailable( hDevice, pAvailable );
        }
        else
        {
            // generic implementation
        }

        return result;
    }